

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode vec_Alloc(CUPDLPvec *vec,cupdlp_int n)

{
  void *pvVar1;
  int in_ESI;
  int *in_RDI;
  cupdlp_retcode retcode;
  uint local_10;
  
  pvVar1 = calloc((long)in_ESI,8);
  *(void **)(in_RDI + 2) = pvVar1;
  if (*(long *)(in_RDI + 2) != 0) {
    *in_RDI = in_ESI;
  }
  local_10 = (uint)(*(long *)(in_RDI + 2) == 0);
  return local_10;
}

Assistant:

cupdlp_retcode vec_Alloc(CUPDLPvec *vec, cupdlp_int n) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_init_zero_vec_double(vec->data, n);
  vec->len = n;
#ifndef CUPDLP_CPU
  CHECK_CUSPARSE(
      cusparseCreateDnVec(&vec->cuda_vec, n, vec->data, CudaComputeType))
#endif

exit_cleanup:
  return retcode;
}